

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

wchar_t square_trap_timeout(chunk *c,loc grid,wchar_t t_idx)

{
  byte bVar1;
  trap *ptVar2;
  trap *ptVar3;
  square *psVar4;
  ulong extraout_RDX;
  ulong uVar5;
  trap *ptVar6;
  
  psVar4 = square((chunk_conflict *)c,grid);
  ptVar3 = psVar4->trap;
  uVar5 = extraout_RDX;
  while (ptVar3 != (trap *)0x0) {
    ptVar2 = ptVar3->next;
    ptVar6 = ptVar2;
    if ((t_idx < L'\0') || ((uint)ptVar3->t_idx == t_idx)) {
      bVar1 = ptVar3->timeout;
      if (bVar1 != 0) {
        uVar5 = (ulong)bVar1;
        ptVar6 = ptVar3;
      }
      switch(bVar1 != 0) {
      case true:
        return (wchar_t)uVar5;
      }
    }
    else {
      if (ptVar2 == (trap *)0x0) {
        ptVar6 = ptVar3;
      }
      switch(ptVar2 == (trap *)0x0) {
      case true:
        goto switchD_001d3bc8_caseD_1;
      }
    }
    ptVar3 = ptVar6;
  }
switchD_001d3bc8_caseD_1:
  return L'\0';
}

Assistant:

int square_trap_timeout(struct chunk *c, struct loc grid, int t_idx)
{
	struct trap *current_trap = square(c, grid)->trap;
	while (current_trap) {
		/* Get the next trap (may be NULL) */
		struct trap *next_trap = current_trap->next;

		/* If called with a specific index, skip others */
		if ((t_idx >= 0) && (t_idx != current_trap->t_idx)) {
			if (!next_trap) break;
			current_trap = next_trap;
			continue;
		}

		/* If the timer is set, return the value */
		if (current_trap->timeout)
			return current_trap->timeout;

		/* Replace with the next trap */
		current_trap = next_trap;
    }

	return 0;
}